

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cliloop.c
# Opt level: O2

void cli_main_loop(cliloop_pw_setup_t pw_setup,cliloop_pw_check_t pw_check,cliloop_continue_t cont,
                  void *ctx)

{
  int fd;
  void *pvVar1;
  _Bool _Var2;
  int iVar3;
  uint uVar4;
  pollwrapper *pw;
  void *ptr;
  int *piVar5;
  unsigned_long uVar6;
  long lVar7;
  size_t oldlen;
  long lVar8;
  long lVar9;
  unsigned_long local_80;
  int rwx;
  void *local_70;
  unsigned_long next;
  cliloop_pw_check_t local_60;
  cliloop_continue_t local_58;
  cliloop_pw_setup_t local_50;
  long local_48;
  size_t fdsize;
  int fdstate;
  
  local_70 = ctx;
  local_60 = pw_check;
  local_58 = cont;
  local_50 = pw_setup;
  local_80 = getticks();
  fdsize = 0;
  ptr = (void *)0x0;
  pw = pollwrap_new();
  do {
    while( true ) {
      pollwrap_clear(pw);
      _Var2 = (*local_50)(local_70,pw);
      if (!_Var2) goto LAB_0011254d;
      iVar3 = first_fd(&fdstate,&rwx);
      oldlen = 0;
      while (-1 < iVar3) {
        oldlen = oldlen + 1;
        iVar3 = next_fd(&fdstate,&rwx);
      }
      ptr = safegrowarray(ptr,&fdsize,4,oldlen,1,false);
      iVar3 = first_fd(&fdstate,&rwx);
      lVar9 = 0;
      while (-1 < iVar3) {
        *(int *)((long)ptr + lVar9 * 4) = iVar3;
        lVar9 = lVar9 + 1;
        pollwrap_add_fd_rwx(pw,iVar3,rwx);
        iVar3 = next_fd(&fdstate,&rwx);
      }
      _Var2 = toplevel_callback_pending();
      if (_Var2) break;
      _Var2 = run_timers(local_80,&next);
      if (!_Var2) {
        iVar3 = pollwrap_poll_endless(pw);
        goto LAB_00112426;
      }
      while( true ) {
        uVar6 = getticks();
        lVar7 = 0;
        if (uVar6 - local_80 <= next - local_80) {
          lVar7 = next - uVar6;
        }
        lVar8 = lVar7;
        if (0x7ffffffe < lVar7) {
          lVar8 = 0x7fffffff;
        }
        iVar3 = pollwrap_poll_timeout(pw,(int)lVar8);
        if (iVar3 == 0 && lVar7 < 0x80000000) break;
        local_80 = getticks();
        if (-1 < iVar3) goto LAB_001124bb;
        piVar5 = __errno_location();
        if (*piVar5 != 4) goto LAB_0011256c;
      }
      iVar3 = 0;
      local_80 = next;
LAB_001124bb:
      lVar7 = 0;
      while (pvVar1 = local_70, lVar9 != lVar7) {
        fd = *(int *)((long)ptr + lVar7 * 4);
        local_48 = lVar7;
        uVar4 = pollwrap_get_fd_rwx(pw,fd);
        if ((uVar4 & 4) != 0) {
          select_result(fd,4);
        }
        if ((uVar4 & 1) != 0) {
          select_result(fd,1);
        }
        if ((uVar4 & 2) != 0) {
          select_result(fd,2);
        }
        lVar7 = local_48 + 1;
      }
      (*local_60)(local_70,pw);
      _Var2 = run_toplevel_callbacks();
      _Var2 = (*local_58)(pvVar1,iVar3 != 0,_Var2);
      if (!_Var2) {
LAB_0011254d:
        pollwrap_free(pw);
        safefree(ptr);
        return;
      }
    }
    iVar3 = pollwrap_poll_instant(pw);
LAB_00112426:
    if (-1 < iVar3) goto LAB_001124bb;
    piVar5 = __errno_location();
    if (*piVar5 != 4) {
LAB_0011256c:
      perror("poll");
      exit(1);
    }
  } while( true );
}

Assistant:

void cli_main_loop(cliloop_pw_setup_t pw_setup,
                   cliloop_pw_check_t pw_check,
                   cliloop_continue_t cont, void *ctx)
{
    unsigned long now = GETTICKCOUNT();

    int *fdlist = NULL;
    size_t fdsize = 0;

    pollwrapper *pw = pollwrap_new();

    while (true) {
        int rwx;
        int ret;
        int fdstate;
        unsigned long next;

        pollwrap_clear(pw);

        if (!pw_setup(ctx, pw))
            break; /* our client signalled emergency exit */

        /* Count the currently active fds. */
        size_t nfds = 0;
        for (int fd = first_fd(&fdstate, &rwx); fd >= 0;
             fd = next_fd(&fdstate, &rwx))
            nfds++;

        /* Expand the fdlist buffer if necessary. */
        sgrowarray(fdlist, fdsize, nfds);

        /*
         * Add all currently open uxsel fds to pw, and store them in
         * fdlist as well.
         */
        size_t fdcount = 0;
        for (int fd = first_fd(&fdstate, &rwx); fd >= 0;
             fd = next_fd(&fdstate, &rwx)) {
            fdlist[fdcount++] = fd;
            pollwrap_add_fd_rwx(pw, fd, rwx);
        }

        if (toplevel_callback_pending()) {
            ret = pollwrap_poll_instant(pw);
        } else if (run_timers(now, &next)) {
            do {
                unsigned long then;
                long ticks;

                then = now;
                now = GETTICKCOUNT();
                if (now - then > next - then)
                    ticks = 0;
                else
                    ticks = next - now;

                bool overflow = false;
                if (ticks > INT_MAX) {
                    ticks = INT_MAX;
                    overflow = true;
                }

                ret = pollwrap_poll_timeout(pw, ticks);
                if (ret == 0 && !overflow)
                    now = next;
                else
                    now = GETTICKCOUNT();
            } while (ret < 0 && errno == EINTR);
        } else {
            ret = pollwrap_poll_endless(pw);
        }

        if (ret < 0 && errno == EINTR)
            continue;

        if (ret < 0) {
            perror("poll");
            exit(1);
        }

        bool found_fd = (ret > 0);

        for (size_t i = 0; i < fdcount; i++) {
            int fd = fdlist[i];
            int rwx = pollwrap_get_fd_rwx(pw, fd);
            /*
             * We must process exceptional notifications before
             * ordinary readability ones, or we may go straight
             * past the urgent marker.
             */
            if (rwx & SELECT_X)
                select_result(fd, SELECT_X);
            if (rwx & SELECT_R)
                select_result(fd, SELECT_R);
            if (rwx & SELECT_W)
                select_result(fd, SELECT_W);
        }

        pw_check(ctx, pw);

        bool ran_callback = run_toplevel_callbacks();

        if (!cont(ctx, found_fd, ran_callback))
            break;
    }

    pollwrap_free(pw);
    sfree(fdlist);
}